

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          lexeme_t<cfgfile::string_trait_t> *lexeme,tag_t<cfgfile::string_trait_t> *tag)

{
  lexeme_type_t lVar1;
  size_t __n;
  input_stream_t<cfgfile::string_trait_t> *piVar2;
  pointer pcVar3;
  int iVar4;
  exception_t<cfgfile::string_trait_t> *peVar5;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  bool bVar6;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [32];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  string_t local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = lexeme->m_type;
  if (lVar1 == null) {
    peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Unexpected end of file. In file \"","");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_178,local_178 + local_170);
    std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\" on line ","");
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_1b8,local_1b8 + local_1b0);
    std::operator+(&local_c8,&local_e8,&local_198);
    string_trait_t::to_string_abi_cxx11_
              (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_c8,&local_108);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,".","");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1f8,local_1f8 + local_1f0);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1d8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_90);
    __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (lVar1 != finish) {
    if (lVar1 != start) {
      __n = (tag->m_name)._M_string_length;
      if (__n == (lexeme->m_value)._M_string_length) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp((tag->m_name)._M_dataplus._M_p,(lexeme->m_value)._M_dataplus._M_p,__n);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6 != false) {
        local_138._0_8_ = tag;
        std::
        deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
        ::emplace_back<cfgfile::tag_t<cfgfile::string_trait_t>*>
                  ((deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
                    *)&(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack,
                   (tag_t<cfgfile::string_trait_t> **)local_138);
        piVar2 = (this->m_lex).m_stream;
        pcVar3 = (piVar2->m_file_name)._M_dataplus._M_p;
        local_a8 = (undefined4)(this->m_lex).m_line_number;
        uStack_a4 = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
        uStack_a0 = (undefined4)(this->m_lex).m_column_number;
        uStack_9c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
        local_138._0_8_ = (tag_t<cfgfile::string_trait_t> *)(local_138 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,pcVar3,pcVar3 + (piVar2->m_file_name)._M_string_length);
        local_118 = local_a8;
        uStack_114 = uStack_a4;
        uStack_110 = uStack_a0;
        uStack_10c = uStack_9c;
        (*tag->_vptr_tag_t[4])(tag,(string *)local_138);
        if ((tag_t<cfgfile::string_trait_t> *)local_138._0_8_ !=
            (tag_t<cfgfile::string_trait_t> *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
      }
      return bVar6;
    }
    peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_178,local_178 + local_170);
    std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\" on line ","");
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_1b8,local_1b8 + local_1b0);
    std::operator+(&local_c8,&local_e8,&local_198);
    string_trait_t::to_string_abi_cxx11_
              (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_c8,&local_108);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,".","");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1f8,local_1f8 + local_1f0);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1d8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_50);
    __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
             ,"");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_178,local_178 + local_170);
  std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"\" on line ","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_1b8,local_1b8 + local_1b0);
  std::operator+(&local_c8,&local_e8,&local_198);
  string_trait_t::to_string_abi_cxx11_
            (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_c8,&local_108);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,".","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_1f8,local_1f8 + local_1f0);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 &local_1d8);
  exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_70);
  __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}